

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setStepSizeBounds
          (MultipleShootingTranscription *this,double minStepSize,double maxStepsize)

{
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  bool local_1;
  
  if (0.0 < in_XMM0_Qa) {
    if (in_XMM0_Qa * 2.0 < in_XMM1_Qa) {
      *(double *)(in_RDI + 0xb0) = in_XMM0_Qa;
      *(double *)(in_RDI + 0xb8) = in_XMM1_Qa;
      local_1 = true;
    }
    else {
      iDynTree::reportError
                ("MultipleShootingSolver","setStepSizeBounds",
                 "The maximum step size is expected to be greater than twice the minimum.");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("MultipleShootingSolver","setStepSizeBounds",
               "The minimum step size is expected to be positive.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool setStepSizeBounds(const double minStepSize, const double maxStepsize) {
                if (minStepSize <= 0){
                    reportError("MultipleShootingSolver", "setStepSizeBounds","The minimum step size is expected to be positive.");
                    return false;
                }

                if (maxStepsize <= (2 * minStepSize)){
                    reportError("MultipleShootingSolver", "setStepSizeBounds","The maximum step size is expected to be greater than twice the minimum."); //imagine to have a distance between two mesh points slightly greater than the max. It would be impossible to add a mesh point in the middle
                    return false;
                }

                m_minStepSize = minStepSize;
                m_maxStepSize = maxStepsize;

                return true;
            }